

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O1

void __thiscall cmsys::Directory::Directory(Directory *this)

{
  DirectoryInternals *pDVar1;
  
  pDVar1 = (DirectoryInternals *)operator_new(0x38);
  (pDVar1->Files).
  super__Vector_base<cmsys::DirectoryInternals::FileData,_std::allocator<cmsys::DirectoryInternals::FileData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->Files).
  super__Vector_base<cmsys::DirectoryInternals::FileData,_std::allocator<cmsys::DirectoryInternals::FileData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->Files).
  super__Vector_base<cmsys::DirectoryInternals::FileData,_std::allocator<cmsys::DirectoryInternals::FileData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar1->Path)._M_dataplus._M_p = (pointer)&(pDVar1->Path).field_2;
  (pDVar1->Path)._M_string_length = 0;
  (pDVar1->Path).field_2._M_local_buf[0] = '\0';
  this->Internal = pDVar1;
  return;
}

Assistant:

Directory::Directory()
{
  this->Internal = new DirectoryInternals;
}